

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdp.cpp
# Opt level: O3

bool __thiscall CMDPSTATE::AddPred(CMDPSTATE *this,int stateID)

{
  int *piVar1;
  iterator __position;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  int local_4;
  
  piVar1 = (this->PredsID).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  __position._M_current =
       (this->PredsID).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  uVar3 = (uint)((ulong)((long)__position._M_current - (long)piVar1) >> 2);
  if (0 < (int)uVar3) {
    if (*piVar1 == stateID) {
      return true;
    }
    uVar4 = (ulong)(uVar3 & 0x7fffffff);
    uVar2 = 1;
    do {
      uVar5 = uVar2;
      if (uVar4 == uVar5) break;
      uVar2 = uVar5 + 1;
    } while (piVar1[uVar5] != stateID);
    if (uVar5 < uVar4) {
      return true;
    }
  }
  if (__position._M_current ==
      (this->PredsID).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->PredsID,__position,&local_4);
  }
  else {
    *__position._M_current = stateID;
    (this->PredsID).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  return true;
}

Assistant:

bool CMDPSTATE::AddPred(int stateID)
{
    //add the predecessor
    if (!ContainsPred(stateID)) {
#if MEM_CHECK
        DisableMemCheck();
#endif

        PredsID.push_back(stateID);
#if MEM_CHECK
        EnableMemCheck();
#endif
    }

    return true;
}